

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

bool __thiscall
Hospital::Validate_Patient_To_Enter
          (Hospital *this,string *username,string *password,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ulong uVar4;
  string *psVar5;
  pointer pPVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  string username_1;
  string local_78;
  string *local_58;
  string local_50;
  
  pPVar6 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = password;
  if ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar6) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      Human::User_name_Getter_abi_cxx11_
                (&local_78,(Human *)((long)&(pPVar6->super_Human).Id._M_dataplus._M_p + lVar8));
      if ((local_78._M_string_length == username->_M_string_length) &&
         ((local_78._M_string_length == 0 ||
          (iVar3 = bcmp(local_78._M_dataplus._M_p,(username->_M_dataplus)._M_p,
                        local_78._M_string_length), iVar3 == 0)))) {
        Human::Password_Getter_abi_cxx11_
                  (&local_50,
                   (Human *)((long)&(((All_Of_Patients->
                                      super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl
                                      .super__Vector_impl_data._M_start)->super_Human).Id.
                                    _M_dataplus + lVar8));
        _Var2._M_p = local_50._M_dataplus._M_p;
        if (local_50._M_string_length == local_58->_M_string_length) {
          if (local_50._M_string_length == 0) {
            bVar9 = true;
          }
          else {
            iVar3 = bcmp(local_50._M_dataplus._M_p,(local_58->_M_dataplus)._M_p,
                         local_50._M_string_length);
            bVar9 = iVar3 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_50.field_2) {
          operator_delete(_Var2._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        psVar5 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar5 = psVar5 + 0x10;
        pcVar1 = (username->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>(psVar5,pcVar1,pcVar1 + username->_M_string_length)
        ;
        __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      uVar7 = uVar7 + 1;
      pPVar6 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar6 >> 4) *
              -0x30c30c30c30c30c3;
      lVar8 = lVar8 + 0x150;
    } while (uVar7 <= uVar4 && uVar4 - uVar7 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"your username or password is incorrect .",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return false;
}

Assistant:

bool Hospital :: Validate_Patient_To_Enter (string username , string password , vector<Patient>All_Of_Patients) {
    int cntr = 0;

    for (int i = 0; i < All_Of_Patients.size(); ++i) {
        if (All_Of_Patients[i].User_name_Getter() == username && All_Of_Patients[i].Password_Getter() == password) {
            cntr++;
            break;
        }
    }

    try {
        if (cntr == 0) {
            cout << "your username or password is incorrect ." << endl;
            return false;
        } else throw username;
    }
    catch (string username) {
        cout << "you entered successfully ." << endl;
        return true;
    }
}